

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall libtorrent::aux::torrent::verified(torrent *this,piece_index_t piece)

{
  uint *puVar1;
  byte bVar2;
  uint uVar3;
  piece_index_t pVar4;
  
  this->m_num_verified = this->m_num_verified + 1;
  uVar3 = 0x80000000 >> ((byte)piece.m_val & 0x1f);
  pVar4.m_val = piece.m_val + 0x1f;
  if (-1 < piece.m_val) {
    pVar4.m_val = piece.m_val;
  }
  puVar1 = (uint *)((long)(this->m_verified).super_bitfield.m_buf.
                          super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>.
                          _M_t.
                          super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                    + 4 + (long)(pVar4.m_val >> 5) * 4);
  *puVar1 = *puVar1 | uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                      uVar3 << 0x18;
  bVar2 = (this->m_need_save_resume_data).m_val;
  if ((bVar2 & 0x10) == 0) {
    (this->m_need_save_resume_data).m_val = bVar2 | 0x10;
    state_updated(this);
    return;
  }
  return;
}

Assistant:

void torrent::verified(piece_index_t const piece)
	{
		TORRENT_ASSERT(!m_verified.get_bit(piece));
		++m_num_verified;
		m_verified.set_bit(piece);
		set_need_save_resume(torrent_handle::if_download_progress);
	}